

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O3

void __thiscall CItems::RenderPickup(CItems *this,CNetObj_Pickup *pPrev,CNetObj_Pickup *pCurrent)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  IGraphics *pIVar6;
  CGameClient *pCVar7;
  vec2 Pos;
  CEffects *this_00;
  float fVar8;
  float fVar9;
  float fVar10;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar11;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_48;
  
  pIVar6 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar6->super_IInterface)._vptr_IInterface[0x13])
            (pIVar6,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  pCVar7 = (this->super_CComponent).m_pClient;
  uVar2 = pPrev->m_X;
  uVar4 = pPrev->m_Y;
  uVar3 = pCurrent->m_X;
  uVar5 = pCurrent->m_Y;
  fVar8 = pCVar7->m_pClient->m_GameIntraTick;
  local_48.x = fVar8 * ((float)(int)uVar3 - (float)(int)uVar2) + (float)(int)uVar2;
  aVar11.y = fVar8 * ((float)(int)uVar5 - (float)(int)uVar4) + (float)(int)uVar4;
  this_00 = (CEffects *)&pCVar7->m_RenderTools;
  CRenderTools::SelectSprite
            ((CRenderTools *)this_00,*(int *)(&DAT_001d9fd0 + (long)pCurrent->m_Type * 4),0,0,0);
  switch(pCurrent->m_Type) {
  case 2:
    fVar8 = (float)(g_pData->m_Weapons).m_aId[3].m_VisualSize;
    break;
  case 3:
    fVar8 = (float)(g_pData->m_Weapons).m_aId[2].m_VisualSize;
    break;
  case 4:
    fVar8 = (float)(g_pData->m_Weapons).m_aId[4].m_VisualSize;
    break;
  case 5:
    this_00 = ((this->super_CComponent).m_pClient)->m_pEffects;
    Pos.field_1.y = aVar11.y;
    Pos.field_0.x = local_48.x;
    CEffects::PowerupShine(this_00,Pos,(vec2)0x4190000042c00000);
    local_48.x = local_48.x + -10.0;
    fVar8 = 128.0;
    break;
  case 6:
    fVar8 = (float)(g_pData->m_Weapons).m_aId[1].m_VisualSize;
    break;
  case 7:
    fVar8 = (float)((g_pData->m_Weapons).m_aId)->m_VisualSize;
    break;
  default:
    fVar8 = 64.0;
  }
  fVar1 = ((this->super_CComponent).m_pClient)->m_pClient->m_LocalTime;
  if (RenderPickup(CNetObj_Pickup_const*,CNetObj_Pickup_const*)::s_LastLocalTime == '\0') {
    RenderPickup((CItems *)this_00);
  }
  fVar9 = fVar1 - RenderPickup::s_LastLocalTime;
  fVar10 = CGameClient::GetAnimationPlaybackSpeed((this->super_CComponent).m_pClient);
  RenderPickup::s_Time = fVar10 * fVar9 + RenderPickup::s_Time;
  fVar10 = aVar11.y * 0.03125 + local_48.x * 0.03125;
  fVar9 = cosf(RenderPickup::s_Time + RenderPickup::s_Time + fVar10);
  fVar10 = sinf(RenderPickup::s_Time + RenderPickup::s_Time + fVar10);
  RenderPickup::s_LastLocalTime = fVar1;
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(0)
  ;
  CRenderTools::DrawSprite
            (&((this->super_CComponent).m_pClient)->m_RenderTools,fVar9 * 2.5 + local_48.x,
             fVar10 * 2.5 + aVar11.y,fVar8);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  return;
}

Assistant:

void CItems::RenderPickup(const CNetObj_Pickup *pPrev, const CNetObj_Pickup *pCurrent)
{
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->QuadsBegin();
	vec2 Pos = mix(vec2(pPrev->m_X, pPrev->m_Y), vec2(pCurrent->m_X, pCurrent->m_Y), Client()->IntraGameTick());
	float Size = 64.0f;
	const int aSprites[] = {
		SPRITE_PICKUP_HEALTH,
		SPRITE_PICKUP_ARMOR,
		SPRITE_PICKUP_GRENADE,
		SPRITE_PICKUP_SHOTGUN,
		SPRITE_PICKUP_LASER,
		SPRITE_PICKUP_NINJA,
		SPRITE_PICKUP_GUN,
		SPRITE_PICKUP_HAMMER
	};
	RenderTools()->SelectSprite(aSprites[pCurrent->m_Type]);

	switch(pCurrent->m_Type)
	{
	case PICKUP_GRENADE:
		Size = g_pData->m_Weapons.m_aId[WEAPON_GRENADE].m_VisualSize;
		break;
	case PICKUP_SHOTGUN:
		Size = g_pData->m_Weapons.m_aId[WEAPON_SHOTGUN].m_VisualSize;
		break;
	case PICKUP_LASER:
		Size = g_pData->m_Weapons.m_aId[WEAPON_LASER].m_VisualSize;
		break;
	case PICKUP_NINJA:
		m_pClient->m_pEffects->PowerupShine(Pos, vec2(96,18));
		Size *= 2.0f;
		Pos.x -= 10.0f;
		break;
	case PICKUP_GUN:
		Size = g_pData->m_Weapons.m_aId[WEAPON_GUN].m_VisualSize;
		break;
	case PICKUP_HAMMER:
		Size = g_pData->m_Weapons.m_aId[WEAPON_HAMMER].m_VisualSize;
		break;
	}

	const float Now = Client()->LocalTime();
	static float s_Time = 0.0f;
	static float s_LastLocalTime = Now;
	s_Time += (Now - s_LastLocalTime) * m_pClient->GetAnimationPlaybackSpeed();
	const float Offset = Pos.y/32.0f + Pos.x/32.0f;
	Pos.x += cosf(s_Time*2.0f+Offset)*2.5f;
	Pos.y += sinf(s_Time*2.0f+Offset)*2.5f;
	s_LastLocalTime = Now;

	Graphics()->QuadsSetRotation(0.0f);
	RenderTools()->DrawSprite(Pos.x, Pos.y, Size);
	Graphics()->QuadsEnd();
}